

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_example_test.c
# Opt level: O0

void add_and_wait_mu(string_priority_queue_mu *q,nsync_time delay,int n,char **s)

{
  int local_34;
  int i;
  char **s_local;
  int n_local;
  string_priority_queue_mu *q_local;
  nsync_time delay_local;
  
  for (local_34 = 0; local_34 != n; local_34 = local_34 + 1) {
    string_priority_queue_mu_add(q,s[local_34]);
    nsync_time_sleep(delay);
  }
  return;
}

Assistant:

static void add_and_wait_mu (string_priority_queue_mu *q,
			     nsync_time delay, int n, const char *s[]) {
	int i;
	for (i = 0; i != n; i++) {
		string_priority_queue_mu_add (q, s[i]);
		nsync_time_sleep (delay);
	}
}